

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O3

WavFileElement * __thiscall WavFileElement::Flush(WavFileElement *this)

{
  uint *puVar1;
  long in_RSI;
  ui32_t write_count;
  
  puVar1 = *(uint **)(in_RSI + 0x40);
  if (*(uint **)(in_RSI + 0x60) == puVar1) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_EMPTY_FB);
  }
  else {
    *(uint **)(in_RSI + 0x60) = puVar1;
    Kumu::FileWriter::Write((uchar *)this,(uint)in_RSI,puVar1);
  }
  return this;
}

Assistant:

ASDCP::Result_t Flush()
  {
    ui32_t write_count = 0;

    if ( m_p == m_Buf.Data() )
      return ASDCP::RESULT_EMPTY_FB;

    ui32_t write_size = m_p - m_Buf.Data();
    m_p = m_Buf.Data();
    return Write(m_Buf.RoData(), write_size, &write_count);
  }